

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_dc_left_predictor_16x16_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  ptrdiff_t in_RSI;
  uint16_t *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i dc;
  __m128i sum;
  __m128i eight;
  ushort local_b8;
  ushort uStackY_b6;
  ushort uStackY_b4;
  ushort uStackY_b2;
  ushort uStackY_b0;
  ushort uStackY_ae;
  ushort uStackY_ac;
  ushort uStackY_aa;
  uint16_t *local_58;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short local_18;
  short sStack_16;
  short sStack_14;
  short sStack_12;
  ushort uStack_10;
  ushort uStack_e;
  ushort uStack_c;
  ushort uStack_a;
  
  local_58 = SUB168(ZEXT416(8),0);
  dc_sum_16(local_58);
  local_18 = (short)extraout_XMM0_Qa;
  sStack_16 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
  sStack_14 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
  sStack_12 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
  uStack_10 = (ushort)extraout_XMM0_Qb;
  uStack_e = (ushort)((ulong)extraout_XMM0_Qb >> 0x10);
  uStack_c = (ushort)((ulong)extraout_XMM0_Qb >> 0x20);
  local_28 = (short)local_58;
  sStack_26 = (short)((ulong)local_58 >> 0x10);
  sStack_24 = (short)((ulong)local_58 >> 0x20);
  sStack_22 = (short)((ulong)local_58 >> 0x30);
  local_b8 = (ushort)(local_18 + local_28) >> 4;
  uStackY_b6 = (ushort)(sStack_16 + sStack_26) >> 4;
  uStackY_b4 = (ushort)(sStack_14 + sStack_24) >> 4;
  uStackY_b2 = (ushort)(sStack_12 + sStack_22) >> 4;
  uStackY_b0 = uStack_10 >> 4;
  uStackY_ae = uStack_e >> 4;
  uStackY_ac = uStack_c >> 4;
  uStackY_aa = (ushort)((ulong)extraout_XMM0_Qb >> 0x34);
  dc_store_16xh(in_RDI,in_RSI,0x10,(__m128i *)&local_b8);
  return;
}

Assistant:

void aom_highbd_dc_left_predictor_16x16_sse2(uint16_t *dst, ptrdiff_t stride,
                                             const uint16_t *above,
                                             const uint16_t *left, int bd) {
  const __m128i eight = _mm_cvtsi32_si128(8);
  const __m128i sum = dc_sum_16(left);
  const __m128i dc = _mm_srli_epi16(_mm_add_epi16(sum, eight), 4);
  (void)above;
  (void)bd;
  dc_store_16xh(dst, stride, 16, &dc);
}